

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

bool __thiscall
ImPlot::ShadedRenderer<ImPlot::GetterYs<int>,_ImPlot::GetterYRef,_ImPlot::TransformerLogLog>::
operator()(ShadedRenderer<ImPlot::GetterYs<int>,_ImPlot::GetterYRef,_ImPlot::TransformerLogLog>
           *this,ImDrawList *DrawList,ImRect *cull_rect,ImVec2 *uv,int prim)

{
  double dVar1;
  double dVar2;
  double dVar3;
  ImVec2 IVar4;
  GetterYs<int> *pGVar5;
  TransformerLogLog *pTVar6;
  ImPlotPlot *pIVar7;
  GetterYRef *pGVar8;
  ImDrawVert *pIVar9;
  ImDrawIdx *pIVar10;
  double dVar11;
  double dVar12;
  undefined1 auVar13 [16];
  float fVar14;
  undefined1 auVar15 [12];
  ImPlotContext *pIVar16;
  ImPlotContext *pIVar17;
  int iVar18;
  ushort uVar19;
  ImDrawIdx IVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  uint uVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  double dVar29;
  float fVar31;
  float fVar32;
  float fVar33;
  undefined1 auVar30 [16];
  float fVar34;
  float fVar35;
  float fVar36;
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  float fVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  float fVar49;
  undefined1 auVar45 [16];
  
  pIVar16 = GImPlot;
  pGVar5 = this->Getter1;
  dVar29 = (double)(prim + 1);
  pTVar6 = this->Transformer;
  iVar18 = pGVar5->Count;
  iVar18 = *(int *)((long)pGVar5->Ys +
                   (long)(((prim + 1 + pGVar5->Offset) % iVar18 + iVar18) % iVar18) *
                   (long)pGVar5->Stride);
  dVar11 = log10((pGVar5->XScale * dVar29 + pGVar5->X0) / (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar7 = pIVar16->CurrentPlot;
  dVar1 = pIVar16->LogDenX;
  dVar2 = (pIVar7->XAxis).Range.Min;
  dVar3 = (pIVar7->XAxis).Range.Max;
  dVar12 = log10((double)iVar18 / pIVar7->YAxis[pTVar6->YAxis].Range.Min);
  pIVar17 = GImPlot;
  iVar18 = pTVar6->YAxis;
  pIVar7 = pIVar16->CurrentPlot;
  pGVar8 = this->Getter2;
  pTVar6 = this->Transformer;
  auVar37._8_8_ = dVar12;
  auVar37._0_8_ = dVar11;
  dVar11 = pGVar8->YRef;
  auVar13._8_4_ = SUB84(pIVar16->LogDenY[iVar18],0);
  auVar13._0_8_ = dVar1;
  auVar13._12_4_ = (int)((ulong)pIVar16->LogDenY[iVar18] >> 0x20);
  auVar38 = divpd(auVar37,auVar13);
  dVar1 = pIVar7->YAxis[iVar18].Range.Min;
  IVar4 = pIVar16->PixelRange[iVar18].Min;
  fVar28 = (float)(pIVar16->Mx *
                   (((double)(float)auVar38._0_8_ * (dVar3 - dVar2) + dVar2) -
                   (pIVar7->XAxis).Range.Min) + (double)IVar4.x);
  fVar31 = (float)(pIVar16->My[iVar18] *
                   (((double)(float)auVar38._8_8_ * (pIVar7->YAxis[iVar18].Range.Max - dVar1) +
                    dVar1) - dVar1) + (double)IVar4.y);
  dVar12 = log10((dVar29 * pGVar8->XScale + pGVar8->X0) / (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar7 = pIVar17->CurrentPlot;
  dVar1 = pIVar17->LogDenX;
  dVar2 = (pIVar7->XAxis).Range.Min;
  dVar3 = (pIVar7->XAxis).Range.Max;
  dVar11 = log10(dVar11 / pIVar7->YAxis[pTVar6->YAxis].Range.Min);
  iVar18 = pTVar6->YAxis;
  auVar30._8_8_ = dVar11;
  auVar30._0_8_ = dVar12;
  auVar38._8_4_ = SUB84(pIVar17->LogDenY[iVar18],0);
  auVar38._0_8_ = dVar1;
  auVar38._12_4_ = (int)((ulong)pIVar17->LogDenY[iVar18] >> 0x20);
  auVar38 = divpd(auVar30,auVar38);
  pIVar7 = pIVar17->CurrentPlot;
  dVar1 = pIVar7->YAxis[iVar18].Range.Min;
  IVar4 = pIVar17->PixelRange[iVar18].Min;
  fVar26 = (float)(pIVar17->Mx *
                   (((double)(float)auVar38._0_8_ * (dVar3 - dVar2) + dVar2) -
                   (pIVar7->XAxis).Range.Min) + (double)IVar4.x);
  fVar27 = (float)(pIVar17->My[iVar18] *
                   (((double)(float)auVar38._8_8_ * (pIVar7->YAxis[iVar18].Range.Max - dVar1) +
                    dVar1) - dVar1) + (double)IVar4.y);
  fVar14 = (this->P12).x;
  fVar32 = (this->P12).y;
  fVar34 = (this->P11).x;
  fVar35 = (this->P11).y;
  uVar24 = -(uint)(fVar35 < fVar32);
  fVar33 = (float)(~-(uint)(fVar14 <= fVar34) & (uint)fVar14 |
                  (uint)fVar34 & -(uint)(fVar14 <= fVar34));
  fVar36 = (float)(~-(uint)(fVar32 <= fVar35) & (uint)fVar32 |
                  (uint)fVar35 & -(uint)(fVar32 <= fVar35));
  fVar40 = (float)(~-(uint)(fVar34 < fVar14) & (uint)fVar14 |
                  (uint)fVar34 & -(uint)(fVar34 < fVar14));
  fVar49 = (float)(~uVar24 & (uint)fVar32 | (uint)fVar35 & uVar24);
  uVar21 = -(uint)(fVar28 <= fVar33);
  uVar22 = -(uint)(fVar31 <= fVar36);
  uVar23 = -(uint)(fVar40 < fVar28);
  uVar25 = -(uint)(fVar49 < fVar31);
  fVar33 = (float)(~uVar21 & (uint)fVar28 | (uint)fVar33 & uVar21);
  fVar36 = (float)(~uVar22 & (uint)fVar31 | (uint)fVar36 & uVar22);
  fVar40 = (float)(~uVar23 & (uint)fVar28 | (uint)fVar40 & uVar23);
  fVar49 = (float)(~uVar25 & (uint)fVar31 | (uint)fVar49 & uVar25);
  uVar21 = -(uint)(fVar26 <= fVar33);
  uVar22 = -(uint)(fVar27 <= fVar36);
  uVar23 = -(uint)(fVar40 < fVar26);
  uVar25 = -(uint)(fVar49 < fVar27);
  auVar41._0_4_ = (uint)fVar33 & uVar21;
  auVar41._4_4_ = (uint)fVar36 & uVar22;
  auVar41._8_4_ = (uint)fVar40 & uVar23;
  auVar41._12_4_ = (uint)fVar49 & uVar25;
  auVar46._0_4_ = ~uVar21 & (uint)fVar26;
  auVar46._4_4_ = ~uVar22 & (uint)fVar27;
  auVar46._8_4_ = ~uVar23 & (uint)fVar26;
  auVar46._12_4_ = ~uVar25 & (uint)fVar27;
  auVar46 = auVar46 | auVar41;
  fVar33 = (cull_rect->Min).y;
  auVar48._4_4_ = -(uint)(fVar33 < auVar46._4_4_);
  auVar48._0_4_ = -(uint)((cull_rect->Min).x < auVar46._0_4_);
  auVar15._4_8_ = auVar46._8_8_;
  auVar15._0_4_ = -(uint)(auVar46._4_4_ < fVar33);
  auVar47._0_8_ = auVar15._0_8_ << 0x20;
  auVar47._8_4_ = -(uint)(auVar46._8_4_ < (cull_rect->Max).x);
  auVar47._12_4_ = -(uint)(auVar46._12_4_ < (cull_rect->Max).y);
  auVar48._8_8_ = auVar47._8_8_;
  iVar18 = movmskps((int)cull_rect,auVar48);
  if (iVar18 == 0xf) {
    fVar36 = fVar31 * fVar34 - fVar35 * fVar28;
    fVar40 = fVar27 * fVar14 - fVar32 * fVar26;
    fVar33 = fVar32 - fVar27;
    auVar42._4_4_ = fVar33;
    auVar42._0_4_ = fVar33;
    auVar42._8_4_ = fVar33;
    auVar42._12_4_ = fVar33;
    auVar43._4_12_ = auVar42._4_12_;
    auVar43._0_4_ = fVar33 * (fVar34 - fVar28) - (fVar35 - fVar31) * (fVar14 - fVar26);
    auVar39._0_4_ = fVar36 * (fVar14 - fVar26) - fVar40 * (fVar34 - fVar28);
    auVar39._4_4_ = fVar36 * fVar33 - fVar40 * (fVar35 - fVar31);
    auVar39._8_4_ = fVar31 * 0.0 - fVar27 * 0.0;
    auVar39._12_4_ = fVar31 * 0.0 - fVar27 * 0.0;
    auVar45._0_8_ = auVar43._0_8_;
    auVar45._8_4_ = fVar33;
    auVar45._12_4_ = fVar33;
    auVar44._8_8_ = auVar45._8_8_;
    auVar44._4_4_ = auVar43._0_4_;
    auVar44._0_4_ = auVar43._0_4_;
    auVar38 = divps(auVar39,auVar44);
    DrawList->_VtxWritePtr->pos = this->P11;
    DrawList->_VtxWritePtr->uv = *uv;
    pIVar9 = DrawList->_VtxWritePtr;
    pIVar9->col = this->Col;
    pIVar9[1].pos.x = fVar28;
    pIVar9[1].pos.y = fVar31;
    DrawList->_VtxWritePtr[1].uv = *uv;
    pIVar9 = DrawList->_VtxWritePtr;
    pIVar9[1].col = this->Col;
    pIVar9[2].pos = auVar38._0_8_;
    DrawList->_VtxWritePtr[2].uv = *uv;
    pIVar9 = DrawList->_VtxWritePtr;
    pIVar9[2].col = this->Col;
    pIVar9[3].pos = this->P12;
    DrawList->_VtxWritePtr[3].uv = *uv;
    pIVar9 = DrawList->_VtxWritePtr;
    pIVar9[3].col = this->Col;
    IVar4.y = fVar27;
    IVar4.x = fVar26;
    pIVar9[4].pos = IVar4;
    DrawList->_VtxWritePtr[4].uv = *uv;
    pIVar9 = DrawList->_VtxWritePtr;
    pIVar9[4].col = this->Col;
    DrawList->_VtxWritePtr = pIVar9 + 5;
    uVar21 = DrawList->_VtxCurrentIdx;
    pIVar10 = DrawList->_IdxWritePtr;
    IVar20 = (ImDrawIdx)uVar21;
    *pIVar10 = IVar20;
    uVar19 = (byte)((byte)uVar24 & fVar27 < fVar31 | -(fVar32 < fVar35) & -(fVar31 < fVar27)) & 1;
    pIVar10[1] = IVar20 + uVar19 + 1;
    pIVar10[2] = IVar20 + 3;
    pIVar10[3] = IVar20 + 1;
    pIVar10[4] = (uVar19 ^ 3) + IVar20;
    pIVar10[5] = IVar20 + 4;
    DrawList->_IdxWritePtr = pIVar10 + 6;
    DrawList->_VtxCurrentIdx = uVar21 + 5;
  }
  (this->P11).x = fVar28;
  (this->P11).y = fVar31;
  (this->P12).x = fVar26;
  (this->P12).y = fVar27;
  return (char)iVar18 == '\x0f';
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& cull_rect, const ImVec2& uv, int prim) const {
        ImVec2 P21 = Transformer(Getter1(prim+1));
        ImVec2 P22 = Transformer(Getter2(prim+1));
        ImRect rect(ImMin(ImMin(ImMin(P11,P12),P21),P22), ImMax(ImMax(ImMax(P11,P12),P21),P22));
        if (!cull_rect.Overlaps(rect)) {
            P11 = P21;
            P12 = P22;
            return false;
        }
        const int intersect = (P11.y > P12.y && P22.y > P21.y) || (P12.y > P11.y && P21.y > P22.y);
        ImVec2 intersection = Intersection(P11,P21,P12,P22);
        DrawList._VtxWritePtr[0].pos = P11;
        DrawList._VtxWritePtr[0].uv  = uv;
        DrawList._VtxWritePtr[0].col = Col;
        DrawList._VtxWritePtr[1].pos = P21;
        DrawList._VtxWritePtr[1].uv  = uv;
        DrawList._VtxWritePtr[1].col = Col;
        DrawList._VtxWritePtr[2].pos = intersection;
        DrawList._VtxWritePtr[2].uv  = uv;
        DrawList._VtxWritePtr[2].col = Col;
        DrawList._VtxWritePtr[3].pos = P12;
        DrawList._VtxWritePtr[3].uv  = uv;
        DrawList._VtxWritePtr[3].col = Col;
        DrawList._VtxWritePtr[4].pos = P22;
        DrawList._VtxWritePtr[4].uv  = uv;
        DrawList._VtxWritePtr[4].col = Col;
        DrawList._VtxWritePtr += 5;
        DrawList._IdxWritePtr[0] = (ImDrawIdx)(DrawList._VtxCurrentIdx);
        DrawList._IdxWritePtr[1] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1 + intersect);
        DrawList._IdxWritePtr[2] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3);
        DrawList._IdxWritePtr[3] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1);
        DrawList._IdxWritePtr[4] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3 - intersect);
        DrawList._IdxWritePtr[5] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 4);
        DrawList._IdxWritePtr += 6;
        DrawList._VtxCurrentIdx += 5;
        P11 = P21;
        P12 = P22;
        return true;
    }